

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O0

int __thiscall
soplex::SPxHarrisRT<double>::maxDelta
          (SPxHarrisRT<double> *this,double *param_2,double *val,int num,int *idx,double *upd,
          double *vec,double *low,double *up)

{
  double dVar1;
  int iVar2;
  element_type *this_00;
  double *pdVar3;
  int in_ECX;
  int iVar4;
  double *in_RDX;
  long in_RDI;
  long in_R8;
  long in_R9;
  Real RVar5;
  double dVar6;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  double epsilon;
  int i;
  int sel;
  double themax;
  double theval;
  double x;
  SPxRatioTester<double> *in_stack_ffffffffffffff48;
  double local_a8;
  double local_98;
  double local_48;
  double local_40;
  int local_1c;
  
  SPxRatioTester<double>::tolerances(in_stack_ffffffffffffff48);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2b79e4);
  RVar5 = Tolerances::epsilon(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b79fe);
  local_48 = 0.0;
  local_40 = *in_RDX;
  local_1c = in_ECX;
  while (iVar4 = local_1c + -1, local_1c != 0) {
    iVar2 = *(int *)(in_R8 + (long)iVar4 * 4);
    dVar6 = *(double *)(in_R9 + (long)iVar2 * 8);
    local_1c = iVar4;
    if (dVar6 <= RVar5) {
      if (dVar6 < -RVar5) {
        if (-dVar6 <= local_48) {
          local_a8 = local_48;
        }
        else {
          local_a8 = -dVar6;
        }
        local_48 = local_a8;
        dVar6 = ((*(double *)(in_stack_00000010 + (long)iVar2 * 8) -
                 *(double *)(in_stack_00000008 + (long)iVar2 * 8)) - *(double *)(in_RDI + 0x20)) /
                dVar6;
        if ((dVar6 < local_40) &&
           (dVar1 = *(double *)(in_stack_00000010 + (long)iVar2 * 8), pdVar3 = (double *)infinity(),
           -*pdVar3 < dVar1)) {
          local_40 = dVar6;
        }
      }
    }
    else {
      local_98 = dVar6;
      if (dVar6 <= local_48) {
        local_98 = local_48;
      }
      local_48 = local_98;
      dVar6 = ((*(double *)(in_stack_00000018 + (long)iVar2 * 8) -
               *(double *)(in_stack_00000008 + (long)iVar2 * 8)) + *(double *)(in_RDI + 0x20)) /
              dVar6;
      if ((dVar6 < local_40) &&
         (dVar1 = *(double *)(in_stack_00000018 + (long)iVar2 * 8), pdVar3 = (double *)infinity(),
         dVar1 < *pdVar3)) {
        local_40 = dVar6;
      }
    }
  }
  *in_RDX = local_40;
  return -1;
}

Assistant:

int SPxHarrisRT<R>::maxDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
)  const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val >= 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x < theval && up[i] < R(infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x < theval && low[i] > R(-infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}